

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint fmt::v5::internal::
     parse_nonnegative_int<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>&>
               (char **begin,char *end,
               id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
               *eh)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  uint big;
  uint max_int;
  uint value;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
  *eh_local;
  char *end_local;
  char **begin_local;
  
  bVar2 = false;
  if ((*begin != end) && (bVar2 = false, '/' < **begin)) {
    bVar2 = **begin < ':';
  }
  if (!bVar2) {
    __assert_fail("begin != end && \'0\' <= *begin && *begin <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/format.h"
                  ,0x63f,
                  "unsigned int fmt::internal::parse_nonnegative_int(const Char *&, const Char *, ErrorHandler &&) [Char = char, ErrorHandler = fmt::internal::id_adapter<fmt::format_handler<fmt::arg_formatter<fmt::back_insert_range<fmt::internal::basic_buffer<char>>>, char, fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>> &, char> &]"
                 );
  }
  big = 0;
  uVar3 = std::numeric_limits<int>::max();
  do {
    if (uVar3 / 10 < big) {
      big = uVar3 + 1;
      break;
    }
    pcVar1 = *begin;
    *begin = pcVar1 + 1;
    big = big * 10 + *pcVar1 + -0x30;
    bVar2 = false;
    if ((*begin != end) && (bVar2 = false, '/' < **begin)) {
      bVar2 = **begin < ':';
    }
  } while (bVar2);
  if (uVar3 < big) {
    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
    ::on_error(eh,"number is too big");
  }
  return big;
}

Assistant:

FMT_CONSTEXPR unsigned parse_nonnegative_int(
    const Char *&begin, const Char *end, ErrorHandler &&eh) {
  assert(begin != end && '0' <= *begin && *begin <= '9');
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin++ - '0');
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int)
    eh.on_error("number is too big");
  return value;
}